

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O1

uint8_t penguinV::GetPixel(Image *image,uint32_t x,uint32_t y)

{
  ImageTypeManager *pIVar1;
  bool bVar2;
  uint8_t uVar3;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar4;
  imageException *this_00;
  undefined1 *puVar5;
  GetPixelForm1 p_Var6;
  ImageManager manager;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [32];
  pointer ppRStack_80;
  pointer ppRStack_78;
  pointer ppRStack_70;
  pointer pIStack_68;
  pointer pIStack_60;
  pointer pIStack_58;
  pointer pIStack_50;
  pointer pIStack_48;
  pointer pIStack_40;
  uint8_t local_38;
  
  this = ImageTypeManager::instance();
  pFVar4 = ImageTypeManager::functionTable(this,image->_type);
  p_Var6 = pFVar4->GetPixel;
  uVar3 = image->_type;
  if (p_Var6 == (GetPixelForm1)0x0) {
    bVar2 = ImageTypeManager::isIntertypeConversionEnabled(this);
    if (bVar2) {
      ImageTypeManager::imageTypes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,this);
      if (local_a0._0_8_ == local_a0._8_8_) {
        p_Var6 = (GetPixelForm1)0x0;
      }
      else {
        p_Var6 = (GetPixelForm1)0x0;
        pIVar1 = (ImageTypeManager *)local_a0._0_8_;
        do {
          puVar5 = &(pIVar1->_functionTableMap)._M_t._M_impl.field_0x1;
          pFVar4 = ImageTypeManager::functionTable
                             (this,*(uint8_t *)&(pIVar1->_functionTableMap)._M_t._M_impl);
          if (pFVar4->GetPixel != (GetPixelForm1)0x0) {
            uVar3 = *(uint8_t *)&(pIVar1->_functionTableMap)._M_t._M_impl;
            p_Var6 = pFVar4->GetPixel;
            break;
          }
          pIVar1 = (ImageTypeManager *)puVar5;
        } while (puVar5 != (undefined1 *)local_a0._8_8_);
      }
      if ((ImageTypeManager *)local_a0._0_8_ != (ImageTypeManager *)0x0) {
        operator_delete((void *)local_a0._0_8_);
      }
    }
    else {
      p_Var6 = (GetPixelForm1)0x0;
    }
  }
  if (p_Var6 != (GetPixelForm1)0x0) {
    local_a0._0_8_ = ImageTypeManager::instance();
    local_a0._8_8_ = (pointer)0x0;
    local_a0._16_8_ = (pointer)0x0;
    local_a0._24_8_ = (pointer)0x0;
    ppRStack_80 = (pointer)0x0;
    ppRStack_78 = (pointer)0x0;
    ppRStack_70 = (pointer)0x0;
    pIStack_68 = (pointer)0x0;
    pIStack_60 = (pointer)0x0;
    pIStack_58 = (pointer)0x0;
    pIStack_50 = (pointer)0x0;
    pIStack_48 = (pointer)0x0;
    pIStack_40 = (pointer)0x0;
    local_38 = uVar3;
    uVar3 = (*p_Var6)(image,x,y);
    anon_unknown.dwarf_e1608::ImageManager::~ImageManager((ImageManager *)local_a0);
    return uVar3;
  }
  local_e0.field_2._M_allocated_capacity = 0x6e6f6974636e7546;
  local_e0.field_2._8_2_ = 0x20;
  local_e0._M_string_length = 9;
  local_100.field_2._M_allocated_capacity = 0x6c65786950746547;
  local_100._M_string_length = 8;
  local_100.field_2._M_local_buf[8] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::operator+(&local_c0,&local_e0,&local_100);
  local_120.field_2._M_allocated_capacity._0_7_ = 0x746f6e20736920;
  local_120.field_2._M_local_buf[7] = ' ';
  local_120.field_2._8_7_ = 0x64656e69666564;
  local_120._M_string_length = 0xf;
  local_120.field_2._M_local_buf[0xf] = '\0';
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_c0,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,(char *)local_a0._0_8_);
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

uint8_t GetPixel( const Image & image, uint32_t x, uint32_t y )
    {
        initialize( image, GetPixel );
        return func( image, x, y );
    }